

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O0

Metric * __thiscall Metrics::NewMetric(Metrics *this,string *name)

{
  Metric *this_00;
  Metric *local_20;
  Metric *metric;
  string *name_local;
  Metrics *this_local;
  
  metric = (Metric *)name;
  name_local = (string *)this;
  this_00 = (Metric *)operator_new(0x30);
  Metric::Metric(this_00);
  local_20 = this_00;
  std::__cxx11::string::operator=((string *)this_00,(string *)metric);
  local_20->count = 0;
  local_20->sum = 0;
  std::vector<Metric_*,_std::allocator<Metric_*>_>::push_back(&this->metrics_,&local_20);
  return local_20;
}

Assistant:

Metric* Metrics::NewMetric(const string& name) {
  Metric* metric = new Metric;
  metric->name = name;
  metric->count = 0;
  metric->sum = 0;
  metrics_.push_back(metric);
  return metric;
}